

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

BrandedDecl *
kj::_::
CopyConstructArray_<capnp::compiler::NodeTranslator::BrandedDecl,_capnp::compiler::NodeTranslator::BrandedDecl_*,_false,_false>
::apply(BrandedDecl *pos,BrandedDecl *start,BrandedDecl *end)

{
  ExceptionGuard local_30;
  
  if (start != end) {
    do {
      capnp::compiler::NodeTranslator::BrandedDecl::BrandedDecl(pos,start);
      start = start + 1;
      pos = pos + 1;
    } while (start != end);
  }
  local_30.start = pos;
  local_30.pos = pos;
  ExceptionGuard::~ExceptionGuard(&local_30);
  return pos;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(*start);

    if (noexcept(T(*start))) {
      while (start != end) {
        ctor(*pos++, *start++);
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, *start++);
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }